

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O2

char * apprun_string_list_join(char **string_list,char *split)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = apprun_string_list_len(string_list);
  sVar2 = strlen(split);
  uVar5 = (ulong)uVar1;
  uVar1 = 0;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    sVar3 = strlen(string_list[uVar4]);
    uVar1 = uVar1 + (int)sVar2 + (int)sVar3;
  }
  __dest = (char *)calloc((ulong)uVar1,1);
  for (uVar4 = 1; uVar4 - uVar5 != 1; uVar4 = uVar4 + 1) {
    strcat(__dest,string_list[uVar4 - 1]);
    if (uVar4 < uVar5) {
      strcat(__dest,split);
    }
  }
  return __dest;
}

Assistant:

char *apprun_string_list_join(char *const *string_list, char *split) {
    unsigned string_list_len = apprun_string_list_len(string_list);
    unsigned split_len = strlen(split);
    unsigned str_size = 0;

    for (int i = 0; i < string_list_len; i++)
        str_size += strlen(string_list[i]) + split_len;

    char *str = calloc(str_size, sizeof(char));
    for (int i = 0; i < string_list_len; i++) {
        strcat(str, string_list[i]);
        if (i + 1 < string_list_len)
            strcat(str, split);
    }

    return str;
}